

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O1

ThreadLog * __thiscall deqp::egl::ThreadLog::operator<<(ThreadLog *this,char **t)

{
  char *__s;
  size_t sVar1;
  
  __s = *t;
  if (__s == (char *)0x0) {
    std::ios::clear((int)this +
                    (int)(this->m_message).super_basic_ostream<char,_std::char_traits<char>_>.
                         _vptr_basic_ostream[-3]);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,__s,sVar1);
  }
  return this;
}

Assistant:

ThreadLog&					operator<<	(const T& t)				{ m_message << t; return *this; }